

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error entityValueProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  ENCODING *enc_00;
  int iVar1;
  int tok;
  ENCODING *enc;
  char *next;
  char *start;
  char **nextPtr_local;
  char *end_local;
  char *s_local;
  XML_Parser parser_local;
  
  enc_00 = parser->m_encoding;
  next = s;
  start = (char *)nextPtr;
  nextPtr_local = (char **)end;
  end_local = s;
  s_local = (char *)parser;
  while (enc = (ENCODING *)next,
        iVar1 = (*enc_00->scanners[0])(enc_00,next,(char *)nextPtr_local,(char **)&enc), 0 < iVar1)
  {
    next = (char *)enc;
  }
  if ((s_local[0x39c] == '\0') && (iVar1 != 0)) {
    *(char **)start = end_local;
    parser_local._4_4_ = XML_ERROR_NONE;
  }
  else {
    switch(iVar1) {
    case 0:
      parser_local._4_4_ = XML_ERROR_INVALID_TOKEN;
      break;
    case -4:
    default:
      parser_local._4_4_ =
           storeEntityValue((XML_Parser)s_local,enc_00,end_local,(char *)nextPtr_local,
                            XML_ACCOUNT_DIRECT);
      break;
    case -2:
      parser_local._4_4_ = XML_ERROR_PARTIAL_CHAR;
      break;
    case -1:
      parser_local._4_4_ = XML_ERROR_UNCLOSED_TOKEN;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error PTRCALL
entityValueProcessor(XML_Parser parser, const char *s, const char *end,
                     const char **nextPtr) {
  const char *start = s;
  const char *next = s;
  const ENCODING *enc = parser->m_encoding;
  int tok;

  for (;;) {
    tok = XmlPrologTok(enc, start, end, &next);
    /* Note: These bytes are accounted later in:
             - storeEntityValue
    */
    if (tok <= 0) {
      if (! parser->m_parsingStatus.finalBuffer && tok != XML_TOK_INVALID) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      switch (tok) {
      case XML_TOK_INVALID:
        return XML_ERROR_INVALID_TOKEN;
      case XML_TOK_PARTIAL:
        return XML_ERROR_UNCLOSED_TOKEN;
      case XML_TOK_PARTIAL_CHAR:
        return XML_ERROR_PARTIAL_CHAR;
      case XML_TOK_NONE: /* start == end */
      default:
        break;
      }
      /* found end of entity value - can store it now */
      return storeEntityValue(parser, enc, s, end, XML_ACCOUNT_DIRECT);
    }
    start = next;
  }
}